

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwTerm(void)

{
  if (mwInited == 1) {
    mwAbort();
  }
  else if (mwInited == 0) {
    mwWrite("internal: mwTerm(): MEMWATCH has not been started!\n");
  }
  else {
    mwInited = mwInited + -1;
  }
  return;
}

Assistant:

void mwTerm(void)
{
	if (mwInited == 1) {
		mwAbort();
		return;
	}
	if (!mwInited) {
		mwWrite("internal: mwTerm(): MEMWATCH has not been started!\n");
	} else {
		mwInited --;
	}
}